

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Matrix4d * math::view(Matrix4d *__return_storage_ptr__,Tuple4d *from,Tuple4d *to,Tuple4d *up)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  Matrix4d local_258;
  Matrix4d local_1d8;
  int local_154;
  int local_150;
  int i_2;
  int i_1;
  int i;
  Matrix4d ret;
  Tuple4d true_up;
  undefined1 local_88 [8];
  Tuple4d left;
  undefined1 local_48 [8];
  Tuple4d forward;
  Tuple4d *up_local;
  Tuple4d *to_local;
  Tuple4d *from_local;
  
  forward.m_buffer[3] = (double)up;
  operator-((Tuple4d *)(left.m_buffer + 3),to,from);
  Tuple4d::normalize((Tuple4d *)local_48,(Tuple4d *)(left.m_buffer + 3));
  Tuple4d::normalize((Tuple4d *)(true_up.m_buffer + 3),(Tuple4d *)forward.m_buffer[3]);
  cross((Tuple4d *)local_88,(Tuple4d *)local_48,(Tuple4d *)(true_up.m_buffer + 3));
  cross((Tuple4d *)(ret.m_buffer[3] + 3),(Tuple4d *)local_88,(Tuple4d *)local_48);
  identity();
  for (i_2 = 0; i_2 < 3; i_2 = i_2 + 1) {
    pdVar3 = Tuple4d::operator()((Tuple4d *)local_88,(long)i_2);
    dVar1 = *pdVar3;
    pdVar3 = Matrix4d::operator()((Matrix4d *)&i_1,0,(long)i_2);
    *pdVar3 = dVar1;
  }
  for (local_150 = 0; local_150 < 3; local_150 = local_150 + 1) {
    pdVar3 = Tuple4d::operator()((Tuple4d *)(ret.m_buffer[3] + 3),(long)local_150);
    dVar1 = *pdVar3;
    pdVar3 = Matrix4d::operator()((Matrix4d *)&i_1,1,(long)local_150);
    *pdVar3 = dVar1;
  }
  for (local_154 = 0; local_154 < 3; local_154 = local_154 + 1) {
    pdVar3 = Tuple4d::operator()((Tuple4d *)local_48,(long)local_154);
    dVar1 = *pdVar3;
    pdVar3 = Matrix4d::operator()((Matrix4d *)&i_1,2,(long)local_154);
    *pdVar3 = -dVar1;
  }
  identity();
  pdVar3 = Tuple4d::operator()(from,0);
  dVar1 = *pdVar3;
  pdVar3 = Tuple4d::operator()(from,1);
  dVar2 = *pdVar3;
  pdVar3 = Tuple4d::operator()(from,2);
  Matrix4d::translate(&local_1d8,&local_258,-dVar1,-dVar2,-*pdVar3);
  operator*(__return_storage_ptr__,(Matrix4d *)&i_1,&local_1d8);
  return __return_storage_ptr__;
}

Assistant:

math::Matrix4d math::view(const math::Tuple4d &from, const math::Tuple4d &to, const math::Tuple4d &up)
{
    math::Tuple4d forward = (to - from).normalize();
    math::Tuple4d left = cross(forward, up.normalize());
    math::Tuple4d true_up = cross(left, forward);

    math::Matrix4d ret{identity()};

    for (int i = 0; i < 3; i++)
    {
	ret(0, i) = left(i);
    }

    for (int i = 0; i < 3; i++)
    {
	ret(1, i) = true_up(i);
    }

    for (int i = 0; i < 3; i++)
    {
	ret(2, i) = -forward(i);
    }

    return (ret * identity().translate(-from(0), -from(1), -from(2)));
}